

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall Clasp::ShortImplicationsGraph::Propagate::unary(Propagate *this,Literal p,Literal x)

{
  bool bVar1;
  undefined4 in_EDX;
  Antecedent *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  Literal in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = Solver::isTrue((Solver *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffe4);
  uVar2 = true;
  if (!bVar1) {
    Antecedent::Antecedent(in_RDI,(Literal *)in_RDI->data_);
    uVar2 = Solver::force((Solver *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                          (Literal *)
                          CONCAT44(in_stack_ffffffffffffffe4.rep_,in_stack_ffffffffffffffe0),
                          (Antecedent *)CONCAT17(uVar2,in_stack_ffffffffffffffd8));
  }
  return (bool)uVar2;
}

Assistant:

bool unary(Literal p, Literal x) const { return s->isTrue(x) || s->force(x, Antecedent(p)); }